

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.h
# Opt level: O1

void __thiscall
Js::TypedArray<unsigned_char,_true,_true>::MarshalCrossSite_TTDInflate
          (TypedArray<unsigned_char,_true,_true> *this)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  if ((_func_int **)
      (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.super_DynamicObject.
      super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject !=
      (_func_int **)VirtualTableInfo<Js::TypedArray<unsigned_char,_true,_true>_>::Address) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Jsrt/../Runtime/Library/TypedArray.h"
                                ,0x105,"(VirtualTableInfo<TypedArray>::HasVirtualTable(this))",
                                "Derived class need to define marshal");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  (this->super_TypedArrayBase).super_ArrayBufferParent.super_ArrayObject.super_DynamicObject.
  super_RecyclableObject.super_FinalizableObject.super_IRecyclerVisitedObject =
       (IRecyclerVisitedObject)
       VirtualTableInfo<Js::CrossSiteObject<Js::TypedArray<unsigned_char,_true,_true>_>_>::Address;
  return;
}

Assistant:

TypedArray(DynamicType *type): TypedArrayBase(nullptr, 0, 0, sizeof(TypeName), type) { buffer = nullptr; }